

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O2

void libyuv::ScaleAddCols1_16_C
               (int dst_width,int boxheight,int x,int dx,uint32_t *src_ptr,uint16_t *dst_ptr)

{
  uint32_t uVar1;
  uint32_t *src_ptr_00;
  long lVar2;
  ulong uVar3;
  
  uVar3 = 1;
  if (1 < dx >> 0x10) {
    uVar3 = (ulong)(uint)(dx >> 0x10);
  }
  lVar2 = 0;
  if (dst_width < 1) {
    dst_width = 0;
  }
  src_ptr_00 = src_ptr + x;
  for (; dst_width != (int)lVar2; lVar2 = lVar2 + 1) {
    uVar1 = SumPixels_16((int)uVar3,src_ptr_00);
    dst_ptr[lVar2] = (uint16_t)(uVar1 * (int)(0x10000 / (long)(boxheight * (int)uVar3)) >> 0x10);
    src_ptr_00 = src_ptr_00 + uVar3;
  }
  return;
}

Assistant:

static void ScaleAddCols1_16_C(int dst_width,
                               int boxheight,
                               int x,
                               int dx,
                               const uint32_t* src_ptr,
                               uint16_t* dst_ptr) {
  int boxwidth = MIN1(dx >> 16);
  int scaleval = 65536 / (boxwidth * boxheight);
  int i;
  for (i = 0; i < dst_width; ++i) {
    *dst_ptr++ = SumPixels_16(boxwidth, src_ptr + x) * scaleval >> 16;
    x += boxwidth;
  }
}